

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void wabt::anon_unknown_1::AppendInlineExportFields
               (Module *module,ModuleFieldList *fields,Index index)

{
  bool bVar1;
  reference pvVar2;
  reference base;
  ExportModuleField *pEVar3;
  iterator rhs;
  Var local_b0;
  undefined1 local_68 [8];
  iterator __begin2;
  Location last_field_loc;
  
  pvVar2 = intrusive_list<wabt::ModuleField>::back(&module->fields);
  __begin2.node_ = (ModuleField *)(pvVar2->loc).filename.data_;
  __begin2.list_ = (intrusive_list<wabt::ModuleField> *)fields->first_;
  local_68 = (undefined1  [8])fields;
  while( true ) {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = fields;
    bVar1 = intrusive_list<wabt::ModuleField>::iterator::operator!=((iterator *)local_68,rhs);
    if (!bVar1) break;
    base = intrusive_list<wabt::ModuleField>::iterator::operator*((iterator *)local_68);
    pEVar3 = cast<wabt::ExportModuleField,wabt::ModuleField>(base);
    Var::Var(&local_b0,index,(Location *)&__begin2.node_);
    Var::operator=(&(pEVar3->export_).var,&local_b0);
    Var::~Var(&local_b0);
    intrusive_list<wabt::ModuleField>::iterator::operator++((iterator *)local_68);
  }
  Module::AppendFields(module,fields);
  return;
}

Assistant:

void AppendInlineExportFields(Module* module,
                              ModuleFieldList* fields,
                              Index index) {
  Location last_field_loc = module->fields.back().loc;

  for (ModuleField& field : *fields) {
    auto* export_field = cast<ExportModuleField>(&field);
    export_field->export_.var = Var(index, last_field_loc);
  }

  module->AppendFields(fields);
}